

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindImageTexturesTest::iterate(ErrorsBindImageTexturesTest *this)

{
  GLboolean GVar1;
  int iVar2;
  GLenum err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  Enum<int,_2UL> EVar8;
  Texture *local_d20;
  Texture *local_a18;
  Enum<int,_2UL> local_9f8;
  GetNameFunc local_9e8;
  int local_9e0;
  Enum<int,_2UL> local_9d8;
  int local_9c4;
  MessageBuilder local_9c0;
  GLenum local_83c;
  undefined1 local_838 [4];
  GLenum generated_error_4;
  Texture t_texture_1;
  GLuint t_texture_ids_2 [4];
  Enum<int,_2UL> local_808;
  GetNameFunc local_7f8;
  int local_7f0;
  Enum<int,_2UL> local_7e8;
  int local_7d4;
  MessageBuilder local_7d0;
  GLenum local_64c;
  GetNameFunc p_Stack_648;
  GLenum generated_error_3;
  int local_640;
  Enum<int,_2UL> local_638;
  GetNameFunc local_628;
  int local_620;
  Enum<int,_2UL> local_618;
  int local_604;
  MessageBuilder local_600;
  GLenum local_47c;
  undefined1 local_478 [4];
  GLenum generated_error_2;
  Texture t_texture;
  GLuint t_texture_ids_1 [4];
  Enum<int,_2UL> local_448;
  GetNameFunc local_438;
  int local_430;
  Enum<int,_2UL> local_428;
  int local_414;
  MessageBuilder local_410;
  GLenum local_28c;
  size_t sStack_288;
  GLenum generated_error_1;
  GLuint t_texture_ids [4];
  Enum<int,_2UL> local_268;
  GetNameFunc local_258;
  int local_250;
  Enum<int,_2UL> local_248;
  int local_234;
  MessageBuilder local_230;
  GLenum local_ac;
  GLuint local_a8;
  GLenum generated_error;
  GLuint t_first;
  GLsizei t_count;
  size_t i;
  GLuint texture_ids [4];
  undefined1 local_78 [8];
  Texture texture [4];
  size_t validated_index;
  GLint max_textures;
  GLuint invalid_id;
  GLuint first;
  GLsizei count;
  Functions *gl;
  ErrorsBindImageTexturesTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _first = (Functions *)CONCAT44(extraout_var,iVar2);
  invalid_id = 4;
  max_textures = 0;
  validated_index._4_4_ = 1;
  validated_index._0_4_ = 0;
  texture[3].m_context = (Context *)0x3;
  (*_first->getIntegerv)(0x8f38,(GLint *)&validated_index);
  err = (*_first->getError)();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x82a);
  if ((int)(GLuint)validated_index < 4) {
    invalid_id = (GLuint)validated_index;
    texture[3].m_context = (Context *)(long)(int)((GLuint)validated_index - 1);
  }
  local_a18 = (Texture *)local_78;
  do {
    MultiBind::Texture::Texture(local_a18);
    local_a18 = local_a18 + 1;
  } while (local_a18 != (Texture *)&texture[3].m_context);
  MultiBind::Texture::InitStorage
            ((Texture *)local_78,(this->super_TestCase).m_context,0xde1,1,0x8058,8,8,8,false);
  MultiBind::Texture::InitStorage
            ((Texture *)&texture[0].m_context,(this->super_TestCase).m_context,0x8c1a,1,0x8058,8,8,8
             ,false);
  MultiBind::Texture::InitStorage
            ((Texture *)&texture[1].m_context,(this->super_TestCase).m_context,0x8c18,1,0x8058,8,8,8
             ,false);
  MultiBind::Texture::InitStorage
            ((Texture *)&texture[2].m_context,(this->super_TestCase).m_context,0x806f,1,0x8058,8,8,8
             ,false);
  for (_t_first = 0; _t_first < 4; _t_first = _t_first + 1) {
    texture_ids[_t_first - 2] = *(GLuint *)&texture[_t_first - 1].m_context;
  }
  generated_error = 4;
  local_a8 = 0;
  if ((int)(GLuint)validated_index < 4) {
    generated_error = (GLuint)validated_index + 1;
  }
  else {
    local_a8 = (GLuint)validated_index - 3;
  }
  (*_first->bindImageTextures)(local_a8,generated_error,(GLuint *)&i);
  local_ac = (*_first->getError)();
  if (local_ac != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_230,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_234 = 0x856;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_234);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_ac);
    local_258 = EVar8.m_getName;
    local_250 = EVar8.m_value;
    local_248.m_getName = local_258;
    local_248.m_value = local_250;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_248);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x502);
    t_texture_ids._8_8_ = EVar8.m_getName;
    local_268.m_value = EVar8.m_value;
    local_268.m_getName = (GetNameFunc)t_texture_ids._8_8_;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_268);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [49])"BindImageTextures with invalid <first> + <count>");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_230);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x856);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  sStack_288 = i;
  t_texture_ids[0] = texture_ids[0];
  t_texture_ids[1] = texture_ids[1];
  local_ac = 0x502;
  while( true ) {
    GVar1 = (*_first->isTexture)(validated_index._4_4_);
    if (GVar1 != '\x01') break;
    validated_index._4_4_ = validated_index._4_4_ + 1;
  }
  *(GLuint *)((long)&stack0xfffffffffffffd78 + (long)texture[3].m_context * 4) =
       validated_index._4_4_;
  (*_first->bindImageTextures)(max_textures,invalid_id,(GLuint *)&stack0xfffffffffffffd78);
  local_28c = (*_first->getError)();
  if (local_28c != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_410,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_410,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_414 = 0x871;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_414);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_28c);
    local_438 = EVar8.m_getName;
    local_430 = EVar8.m_value;
    local_428.m_getName = local_438;
    local_428.m_value = local_430;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_428);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x502);
    local_448.m_getName = EVar8.m_getName;
    local_448.m_value = EVar8.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_448);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [42])"BindImageTextures with invalid texture id");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_410);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x871);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  t_texture.m_context = (Context *)i;
  MultiBind::Texture::Texture((Texture *)local_478);
  MultiBind::Texture::Init((Texture *)local_478,(this->super_TestCase).m_context);
  MultiBind::Texture::Generate(_first,(GLuint *)local_478);
  MultiBind::Texture::Bind(_first,(GLuint)local_478,0xde1);
  (*_first->texStorage2D)(0xde1,1,0x8c3d,8,0);
  local_47c = (*_first->getError)();
  if (local_47c != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_600,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_600,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_604 = 0x882;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_604);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_47c);
    local_628 = EVar8.m_getName;
    local_620 = EVar8.m_value;
    local_618.m_getName = local_628;
    local_618.m_value = local_620;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_618);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x501);
    p_Stack_648 = EVar8.m_getName;
    local_640 = EVar8.m_value;
    local_638.m_getName = p_Stack_648;
    local_638.m_value = local_640;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_638);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [33])"texStorage2D has height set to 0");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_600);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x882);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  t_texture_ids_1[(long)&texture[3].m_context[-1].field_0x1e] = (GLuint)local_478;
  (*_first->bindImageTextures)(max_textures,invalid_id,(GLuint *)&t_texture.m_context);
  local_64c = (*_first->getError)();
  if (local_64c != 0x502) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_7d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_7d0,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_7d4 = 0x889;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_7d4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_64c);
    local_7f8 = EVar8.m_getName;
    local_7f0 = EVar8.m_value;
    local_7e8.m_getName = local_7f8;
    local_7e8.m_value = local_7f0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_7e8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x502);
    local_808.m_getName = EVar8.m_getName;
    local_808.m_value = EVar8.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_808);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [47])"BindImageTextures with invalid internal format");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7d0);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x889);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  MultiBind::Texture::~Texture((Texture *)local_478);
  t_texture_1.m_context = (Context *)i;
  MultiBind::Texture::Texture((Texture *)local_838);
  MultiBind::Texture::InitStorage
            ((Texture *)local_838,(this->super_TestCase).m_context,0xde1,1,0x8c3d,8,0,8,true);
  t_texture_ids_2[(long)&texture[3].m_context[-1].field_0x1e] = (GLuint)local_838;
  (*_first->bindImageTextures)(max_textures,invalid_id,(GLuint *)&t_texture_1.m_context);
  local_83c = (*_first->getError)();
  if (local_83c != 0x501) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_9c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_9c0,(char (*) [7])0x2a372b5);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", line: ");
    local_9c4 = 0x89d;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9c4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])". Got wrong error: ");
    EVar8 = glu::getErrorStr(local_83c);
    local_9e8 = EVar8.m_getName;
    local_9e0 = EVar8.m_value;
    local_9d8.m_getName = local_9e8;
    local_9d8.m_value = local_9e0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2a22899);
    EVar8 = glu::getErrorStr(0x501);
    local_9f8.m_getName = EVar8.m_getName;
    local_9f8.m_value = EVar8.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9f8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", message: ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [59])
                               "BindImageTextures with 2D texture that has height set to 0");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_9c0);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x89d);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  MultiBind::Texture::~Texture((Texture *)local_838);
  pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
  this_local._4_4_ = STOP;
  local_d20 = (Texture *)&texture[3].m_context;
  do {
    local_d20 = local_d20 + -1;
    MultiBind::Texture::~Texture(local_d20);
  } while (local_d20 != (Texture *)local_78);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindImageTexturesTest::iterate()
{
	static const GLuint  depth		= 8;
	static const GLuint  height		= 8;
	static const GLsizei n_textures = 4;
	static const GLuint  width		= 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLsizei count			= n_textures;
	GLuint  first			= 0;
	GLuint  invalid_id		= 1; /* Start with 1, as 0 is not valid name */
	GLint   max_textures	= 0;
	size_t  validated_index = n_textures - 1;

	/* Get max */
	gl.getIntegerv(GL_MAX_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Select count so <first + count> does not exceed max.
	 * Validated index shall be in the specified range.
	 */
	if (n_textures > max_textures)
	{
		count			= max_textures;
		validated_index = max_textures - 1;
	}

	/* Storage */
	Texture texture[n_textures];
	GLuint  texture_ids[n_textures];

	/* Prepare textures */
	texture[0].InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGBA8, width, height, depth);
	texture[1].InitStorage(m_context, GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, width, height, depth);
	texture[2].InitStorage(m_context, GL_TEXTURE_1D_ARRAY, 1, GL_RGBA8, width, height, depth);
	texture[3].InitStorage(m_context, GL_TEXTURE_3D, 1, GL_RGBA8, width, height, depth);

	for (size_t i = 0; i < n_textures; ++i)
	{
		texture_ids[i] = texture[i].m_id;
	}

	/* - INVALID_OPERATION when <first> + <count> exceed limits; */
	{
		GLsizei t_count = n_textures;
		GLuint  t_first = 0;

		/* Select first so <first + count> exceeds max, avoid negative first */
		if (n_textures <= max_textures)
		{
			t_first = max_textures - n_textures + 1;
		}
		else
		{
			t_count = max_textures + 1;
			/* first = 0; */
		}

		/* Test */
		gl.bindImageTextures(t_first, t_count, texture_ids);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindImageTextures with invalid <first> + <count>");
	}

	/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
	 * existing buffer;
	 */
	{
		GLuint t_texture_ids[n_textures];

		memcpy(t_texture_ids, texture_ids, sizeof(texture_ids));

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isTexture(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		/* Invalidate the entry */
		t_texture_ids[validated_index] = invalid_id;

		/* Test */
		gl.bindImageTextures(first, count, t_texture_ids);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindImageTextures with invalid texture id");
	}

	/* - INVALID_OPERATION if any entry found in <textures> has invalid internal
	 * format at level 0;
	 */
	{
		GLuint t_texture_ids[n_textures];

		memcpy(t_texture_ids, texture_ids, sizeof(texture_ids));

		/* Prepare texture with invalid format */
		Texture t_texture;
		t_texture.Init(m_context);
		t_texture.Generate(gl, t_texture.m_id);
		t_texture.Bind(gl, t_texture.m_id, GL_TEXTURE_2D);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGB9_E5, width, 0);
		CHECK_ERROR(GL_INVALID_VALUE, "texStorage2D has height set to 0");

		/* Invalidate the entry */
		t_texture_ids[validated_index] = t_texture.m_id;

		/* Test */
		gl.bindImageTextures(first, count, t_texture_ids);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindImageTextures with invalid internal format");
	}

	/* - INVALID_VALUE when any entry in <textures> has any of dimensions equal
	 * to 0 at level 0.
	 */
	{
		GLuint t_texture_ids[n_textures];

		memcpy(t_texture_ids, texture_ids, sizeof(texture_ids));

		/* Prepare texture with invalid format */
		Texture t_texture;
		t_texture.InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGB9_E5, width, 0, depth, true);

		/* Invalidate the entry */
		t_texture_ids[validated_index] = t_texture.m_id;

		/* Test */
		gl.bindImageTextures(first, count, t_texture_ids);
		CHECK_ERROR(GL_INVALID_VALUE, "BindImageTextures with 2D texture that has height set to 0");
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}